

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compress_insertDictionary
                 (ZSTD_compressedBlockState_t *bs,ZSTD_matchState_t *ms,ldmState_t *ls,
                 ZSTD_cwksp *ws,ZSTD_CCtx_params *params,void *dict,size_t dictSize,
                 ZSTD_dictContentType_e dictContentType,ZSTD_dictTableLoadMethod_e dtlm,
                 ZSTD_tableFillPurpose_e tfp,void *workspace)

{
  U32 UVar1;
  void *dict_local;
  ZSTD_CCtx_params *params_local;
  ZSTD_cwksp *ws_local;
  ldmState_t *ls_local;
  ZSTD_matchState_t *ms_local;
  ZSTD_compressedBlockState_t *bs_local;
  
  if ((dict == (void *)0x0) || (dictSize < 8)) {
    if (dictContentType == ZSTD_dct_fullDict) {
      bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe0;
    }
    else {
      bs_local = (ZSTD_compressedBlockState_t *)0x0;
    }
  }
  else {
    ZSTD_reset_compressedBlockState(bs);
    if (dictContentType == ZSTD_dct_rawContent) {
      bs_local = (ZSTD_compressedBlockState_t *)
                 ZSTD_loadDictionaryContent(ms,ls,ws,params,dict,dictSize,dtlm,tfp);
    }
    else {
      UVar1 = MEM_readLE32(dict);
      if (UVar1 == 0xec30a437) {
        bs_local = (ZSTD_compressedBlockState_t *)
                   ZSTD_loadZstdDictionary(bs,ms,ws,params,dict,dictSize,dtlm,tfp,workspace);
      }
      else if (dictContentType == ZSTD_dct_auto) {
        bs_local = (ZSTD_compressedBlockState_t *)
                   ZSTD_loadDictionaryContent(ms,ls,ws,params,dict,dictSize,dtlm,tfp);
      }
      else {
        if (dictContentType != ZSTD_dct_fullDict) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/compress/zstd_compress.c"
                        ,0x137a,
                        "size_t ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t *, ZSTD_matchState_t *, ldmState_t *, ZSTD_cwksp *, const ZSTD_CCtx_params *, const void *, size_t, ZSTD_dictContentType_e, ZSTD_dictTableLoadMethod_e, ZSTD_tableFillPurpose_e, void *)"
                       );
        }
        bs_local = (ZSTD_compressedBlockState_t *)0xffffffffffffffe0;
      }
    }
  }
  return (size_t)bs_local;
}

Assistant:

static size_t
ZSTD_compress_insertDictionary(ZSTD_compressedBlockState_t* bs,
                               ZSTD_matchState_t* ms,
                               ldmState_t* ls,
                               ZSTD_cwksp* ws,
                         const ZSTD_CCtx_params* params,
                         const void* dict, size_t dictSize,
                               ZSTD_dictContentType_e dictContentType,
                               ZSTD_dictTableLoadMethod_e dtlm,
                               ZSTD_tableFillPurpose_e tfp,
                               void* workspace)
{
    DEBUGLOG(4, "ZSTD_compress_insertDictionary (dictSize=%u)", (U32)dictSize);
    if ((dict==NULL) || (dictSize<8)) {
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong, "");
        return 0;
    }

    ZSTD_reset_compressedBlockState(bs);

    /* dict restricted modes */
    if (dictContentType == ZSTD_dct_rawContent)
        return ZSTD_loadDictionaryContent(ms, ls, ws, params, dict, dictSize, dtlm, tfp);

    if (MEM_readLE32(dict) != ZSTD_MAGIC_DICTIONARY) {
        if (dictContentType == ZSTD_dct_auto) {
            DEBUGLOG(4, "raw content dictionary detected");
            return ZSTD_loadDictionaryContent(
                ms, ls, ws, params, dict, dictSize, dtlm, tfp);
        }
        RETURN_ERROR_IF(dictContentType == ZSTD_dct_fullDict, dictionary_wrong, "");
        assert(0);   /* impossible */
    }

    /* dict as full zstd dictionary */
    return ZSTD_loadZstdDictionary(
        bs, ms, ws, params, dict, dictSize, dtlm, tfp, workspace);
}